

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

void __thiscall
leveldb::FindFileTest::Add
          (FindFileTest *this,char *smallest,char *largest,SequenceNumber smallest_seq,
          SequenceNumber largest_seq)

{
  FileMetaData *this_00;
  FileMetaData *f;
  Slice local_60;
  string local_50 [32];
  
  this_00 = (FileMetaData *)operator_new(0x58);
  FileMetaData::FileMetaData(this_00);
  this_00->number =
       ((long)(this->files_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->files_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3) + 1;
  f = this_00;
  local_60.data_ = smallest;
  local_60.size_ = strlen(smallest);
  InternalKey::InternalKey((InternalKey *)local_50,&local_60,smallest_seq,kTypeValue);
  std::__cxx11::string::operator=((string *)&this_00->smallest,local_50);
  std::__cxx11::string::_M_dispose();
  local_60.data_ = largest;
  local_60.size_ = strlen(largest);
  InternalKey::InternalKey((InternalKey *)local_50,&local_60,largest_seq,kTypeValue);
  std::__cxx11::string::operator=((string *)&this_00->largest,local_50);
  std::__cxx11::string::_M_dispose();
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            (&this->files_,&f);
  return;
}

Assistant:

void Add(const char* smallest, const char* largest,
           SequenceNumber smallest_seq = 100,
           SequenceNumber largest_seq = 100) {
    FileMetaData* f = new FileMetaData;
    f->number = files_.size() + 1;
    f->smallest = InternalKey(smallest, smallest_seq, kTypeValue);
    f->largest = InternalKey(largest, largest_seq, kTypeValue);
    files_.push_back(f);
  }